

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode Curl_sendf(curl_socket_t sockfd,connectdata *conn,char *fmt,...)

{
  Curl_easy *data;
  ssize_t sVar1;
  char in_AL;
  CURLcode CVar2;
  char *__s;
  size_t len;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  ssize_t bytes_written;
  char *local_110;
  va_list ap;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  ap[0].reg_save_area = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  data = conn->data;
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 0x18;
  ap[0].fp_offset = 0x30;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  __s = curl_mvaprintf(fmt,ap);
  if (__s == (char *)0x0) {
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  else {
    bytes_written = 0;
    len = strlen(__s);
    local_110 = __s;
    while( true ) {
      CVar2 = Curl_write(conn,sockfd,__s,len,&bytes_written);
      sVar1 = bytes_written;
      if (CVar2 != CURLE_OK) break;
      if ((data->set).verbose == true) {
        Curl_debug(data,CURLINFO_DATA_OUT,__s,bytes_written,conn);
      }
      len = len - sVar1;
      if (len == 0) break;
      __s = __s + sVar1;
    }
    (*Curl_cfree)(local_110);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_sendf(curl_socket_t sockfd, struct connectdata *conn,
                    const char *fmt, ...)
{
  struct Curl_easy *data = conn->data;
  ssize_t bytes_written;
  size_t write_len;
  CURLcode result = CURLE_OK;
  char *s;
  char *sptr;
  va_list ap;
  va_start(ap, fmt);
  s = vaprintf(fmt, ap); /* returns an allocated string */
  va_end(ap);
  if(!s)
    return CURLE_OUT_OF_MEMORY; /* failure */

  bytes_written = 0;
  write_len = strlen(s);
  sptr = s;

  for(;;) {
    /* Write the buffer to the socket */
    result = Curl_write(conn, sockfd, sptr, write_len, &bytes_written);

    if(result)
      break;

    if(data->set.verbose)
      Curl_debug(data, CURLINFO_DATA_OUT, sptr, (size_t)bytes_written, conn);

    if((size_t)bytes_written != write_len) {
      /* if not all was written at once, we must advance the pointer, decrease
         the size left and try again! */
      write_len -= bytes_written;
      sptr += bytes_written;
    }
    else
      break;
  }

  free(s); /* free the output string */

  return result;
}